

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# treemodel.h
# Opt level: O0

void __thiscall TreeModel::TreeModel(TreeModel *this,QObject *parent)

{
  TreeItem *this_00;
  QByteArray local_b8;
  QByteArray local_a0;
  QByteArray local_88;
  QString local_70;
  QString local_58;
  QString local_40;
  QObject *local_18;
  QObject *parent_local;
  TreeModel *this_local;
  
  local_18 = parent;
  parent_local = (QObject *)this;
  QAbstractItemModel::QAbstractItemModel(&this->super_QAbstractItemModel,parent);
  *(undefined ***)this = &PTR_metaObject_0037a648;
  this->markingEnabledFlag = true;
  this->markingDarkModeFlag = false;
  this_00 = (TreeItem *)operator_new(0xf0);
  QString::QString(&local_40);
  QString::QString(&local_58);
  QString::QString(&local_70);
  QByteArray::QByteArray(&local_88);
  QByteArray::QByteArray(&local_a0);
  QByteArray::QByteArray(&local_b8);
  TreeItem::TreeItem(this_00,0,'<','\0',&local_40,&local_58,&local_70,&local_88,&local_a0,&local_b8,
                     true,false,(TreeItem *)0x0);
  this->rootItem = this_00;
  QByteArray::~QByteArray(&local_b8);
  QByteArray::~QByteArray(&local_a0);
  QByteArray::~QByteArray(&local_88);
  QString::~QString(&local_70);
  QString::~QString(&local_58);
  QString::~QString(&local_40);
  return;
}

Assistant:

TreeModel(QObject *parent = 0) : QAbstractItemModel(parent), markingEnabledFlag(true), markingDarkModeFlag(false) {
        rootItem = new TreeItem(0, Types::Root, 0, UString(), UString(), UString(), UByteArray(), UByteArray(), UByteArray(), true, false);
    }